

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service_test.cxx
# Opt level: O0

int asio_service_test::auto_quorum_size_election_test(void)

{
  initializer_list<RaftAsioPkg_*> __l;
  initializer_list<std::shared_ptr<nuraft::buffer>_> __l_00;
  initializer_list<std::shared_ptr<nuraft::buffer>_> __l_01;
  initializer_list<RaftAsioPkg_*> __l_02;
  initializer_list<std::shared_ptr<nuraft::buffer>_> __l_03;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  size_t sVar4;
  void *pvVar5;
  TestSm *pTVar6;
  element_type *peVar7;
  int __how;
  int __how_00;
  int __how_01;
  allocator<char> *this;
  uint64_t _v_11;
  uint64_t _ev_8;
  uint64_t _v_10;
  uint64_t _ev_7;
  buffer_serializer bs_2;
  ptr<buffer> msg_2;
  string msg_str_2;
  size_t ii_2;
  int _v_9;
  int _ev_6;
  int _v_8;
  int _ev_5;
  uint64_t _v_7;
  uint64_t _ev_4;
  int _v_6;
  RaftAsioPkg s1_new;
  uint64_t _v_5;
  uint64_t _ev_3;
  buffer_serializer bs_1;
  ptr<buffer> msg_1;
  string msg_str_1;
  size_t ii_1;
  uint64_t committed_idx;
  int _v_4;
  int _ev_2;
  buffer_serializer bs;
  ptr<buffer> msg;
  string msg_str;
  size_t ii;
  int _v_3;
  int _ev_1;
  int _v_2;
  int _ev;
  raft_params params;
  anon_class_1_0_00000001 custom_inc_term;
  int _v_1;
  int _v;
  vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> pkgs;
  shared_ptr<RaftAsioPkg> s2;
  shared_ptr<RaftAsioPkg> s1;
  string s2_addr;
  string s1_addr;
  raft_server *in_stack_ffffffffffffe268;
  allocator *msg_00;
  RaftAsioPkg *in_stack_ffffffffffffe270;
  raft_server *in_stack_ffffffffffffe278;
  raft_server *in_stack_ffffffffffffe280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe290;
  allocator_type *in_stack_ffffffffffffe298;
  vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *in_stack_ffffffffffffe2a0;
  iterator in_stack_ffffffffffffe2a8;
  size_type in_stack_ffffffffffffe2b0;
  inc_term_func *in_stack_ffffffffffffe2c8;
  raft_server *in_stack_ffffffffffffe2d0;
  raft_server *in_stack_ffffffffffffe2d8;
  raft_server *in_stack_ffffffffffffe2e0;
  size_t in_stack_ffffffffffffe3b8;
  TestSm *in_stack_ffffffffffffe3c0;
  TestSm *in_stack_ffffffffffffe3c8;
  init_options *in_stack_ffffffffffffe448;
  undefined8 in_stack_ffffffffffffe450;
  undefined7 in_stack_ffffffffffffe458;
  undefined1 in_stack_ffffffffffffe45f;
  undefined4 in_stack_ffffffffffffe468;
  undefined4 in_stack_ffffffffffffe46c;
  undefined8 **local_1b10;
  undefined8 **local_13c0;
  undefined8 **local_fd8;
  allocator local_9a9;
  string local_9a8 [32];
  native_handle_type local_988;
  char local_97d;
  int local_97c;
  string local_978 [32];
  ulong local_958;
  ulong local_950;
  native_handle_type local_948;
  char local_93d;
  int local_93c;
  string local_938 [32];
  ulong local_918;
  ulong local_910;
  allocator local_901;
  string local_900 [40];
  undefined8 *local_8d8 [2];
  undefined1 **local_8c8;
  undefined8 local_8c0;
  string local_868 [32];
  ulong local_848;
  native_handle_type local_840;
  char local_835;
  int local_834;
  string local_830 [32];
  int32 local_810;
  int local_80c;
  native_handle_type local_808;
  char local_7fd;
  int local_7fc;
  string local_7f8 [32];
  int32 local_7d8;
  int local_7d4;
  native_handle_type local_7d0;
  char local_7c5;
  int local_7c4;
  string local_7c0 [32];
  native_handle_type local_7a0;
  char local_795;
  int local_794;
  string local_790 [32];
  ulong local_770;
  ulong local_768;
  allocator local_759;
  string local_758 [32];
  native_handle_type local_738;
  char local_72d;
  int local_72c;
  string local_728 [88];
  undefined1 *local_6d0;
  undefined1 **local_6c8;
  undefined8 local_6c0;
  int local_69c;
  undefined1 local_698 [288];
  native_handle_type local_578;
  char local_56d;
  int local_56c;
  string local_568 [32];
  ulong local_548;
  ulong local_540;
  allocator local_531;
  string local_530 [40];
  undefined8 *local_508 [2];
  undefined1 **local_4f8;
  undefined8 local_4f0;
  string local_498 [32];
  ulong local_478;
  ulong local_470;
  native_handle_type local_468;
  char local_45d;
  int local_45c;
  string local_458 [32];
  int32 local_438;
  int local_434;
  native_handle_type local_430;
  char local_425;
  int local_424;
  string local_420 [39];
  allocator local_3f9;
  string local_3f8 [32];
  native_handle_type local_3d8;
  char local_3cd;
  int local_3cc;
  string local_3c8 [39];
  allocator local_3a1;
  string local_3a0 [40];
  undefined8 *local_378 [2];
  undefined1 **local_368;
  undefined8 local_360;
  string local_308 [32];
  ulong local_2e8;
  native_handle_type local_2e0;
  char local_2d5;
  int local_2d4;
  string local_2d0 [32];
  int32 local_2b0;
  int local_2ac;
  native_handle_type local_2a8;
  char local_29d;
  int local_29c;
  string local_298 [32];
  int32 local_278;
  int local_274;
  native_handle_type local_270;
  char local_265;
  int local_264;
  string local_260 [114];
  undefined1 local_1ee;
  allocator local_191;
  string local_190 [32];
  native_handle_type local_170;
  char local_165;
  int local_164;
  string local_160 [32];
  int local_140;
  undefined4 local_13c;
  native_handle_type local_138;
  char local_12d;
  int local_12c;
  string local_128 [80];
  int local_d8;
  element_type *local_d0;
  element_type *local_c8;
  element_type **local_c0;
  undefined8 local_b8;
  undefined4 local_94;
  __shared_ptr<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2> local_90;
  undefined4 local_7c;
  __shared_ptr<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2> local_78;
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [36];
  int local_4;
  
  raft_functional_common::reset_log_files();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"tcp://127.0.0.1:20010",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"tcp://127.0.0.1:20020",&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  local_7c = 1;
  std::make_shared<RaftAsioPkg,int,std::__cxx11::string&>
            ((int *)in_stack_ffffffffffffe298,in_stack_ffffffffffffe290);
  local_94 = 2;
  std::make_shared<RaftAsioPkg,int,std::__cxx11::string&>
            ((int *)in_stack_ffffffffffffe298,in_stack_ffffffffffffe290);
  local_d0 = std::__shared_ptr<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2>::get(&local_78);
  local_c8 = std::__shared_ptr<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2>::get(&local_90);
  local_c0 = &local_d0;
  local_b8 = 2;
  std::allocator<RaftAsioPkg_*>::allocator((allocator<RaftAsioPkg_*> *)0x1a93fb);
  __l._M_len = in_stack_ffffffffffffe2b0;
  __l._M_array = (iterator)in_stack_ffffffffffffe2a8;
  std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::vector
            (in_stack_ffffffffffffe2a0,__l,in_stack_ffffffffffffe298);
  std::allocator<RaftAsioPkg_*>::~allocator((allocator<RaftAsioPkg_*> *)0x1a942f);
  TestSuite::_msg("launching asio-raft servers\n");
  nuraft::raft_server::init_options::init_options((init_options *)in_stack_ffffffffffffe270);
  iVar2 = launch_servers((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)
                         CONCAT17(in_stack_ffffffffffffe45f,in_stack_ffffffffffffe458),
                         SUB81((ulong)in_stack_ffffffffffffe450 >> 0x38,0),
                         SUB81((ulong)in_stack_ffffffffffffe450 >> 0x30,0),
                         SUB81((ulong)in_stack_ffffffffffffe450 >> 0x28,0),in_stack_ffffffffffffe448
                        );
  nuraft::raft_server::init_options::~init_options((init_options *)0x1a9482);
  local_d8 = iVar2;
  if (iVar2 == 0) {
    TestSuite::_msg("organizing raft group\n");
    local_140 = make_group((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)
                           CONCAT44(in_stack_ffffffffffffe46c,in_stack_ffffffffffffe468));
    if (local_140 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_190,"wait for Raft group ready",&local_191);
      TestSuite::sleep_sec((size_t)in_stack_ffffffffffffe270,(string *)in_stack_ffffffffffffe268);
      std::__cxx11::string::~string(local_190);
      std::allocator<char>::~allocator((allocator<char> *)&local_191);
      std::__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1a9fe1);
      std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1a9fed);
      std::function<unsigned_long(unsigned_long)>::
      function<asio_service_test::auto_quorum_size_election_test()::__0&,void>
                ((function<unsigned_long_(unsigned_long)> *)in_stack_ffffffffffffe280,
                 (anon_class_1_0_00000001 *)in_stack_ffffffffffffe278);
      nuraft::raft_server::set_inc_term_func(in_stack_ffffffffffffe2d0,in_stack_ffffffffffffe2c8);
      std::function<unsigned_long_(unsigned_long)>::~function
                ((function<unsigned_long_(unsigned_long)> *)0x1aa036);
      std::__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1aa043);
      std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1aa04f);
      std::function<unsigned_long(unsigned_long)>::
      function<asio_service_test::auto_quorum_size_election_test()::__0&,void>
                ((function<unsigned_long_(unsigned_long)> *)in_stack_ffffffffffffe280,
                 (anon_class_1_0_00000001 *)in_stack_ffffffffffffe278);
      nuraft::raft_server::set_inc_term_func(in_stack_ffffffffffffe2d0,in_stack_ffffffffffffe2c8);
      std::function<unsigned_long_(unsigned_long)>::~function
                ((function<unsigned_long_(unsigned_long)> *)0x1aa098);
      std::__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1aa0a5);
      std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1aa0b1);
      nuraft::raft_server::get_current_params(in_stack_ffffffffffffe280);
      local_1ee = 1;
      std::__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1aa0d8);
      std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1aa0e4);
      nuraft::raft_server::update_params
                (in_stack_ffffffffffffe2e0,(raft_params *)in_stack_ffffffffffffe2d8);
      std::__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1aa103);
      std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1aa10f);
      nuraft::raft_server::update_params
                (in_stack_ffffffffffffe2e0,(raft_params *)in_stack_ffffffffffffe2d8);
      std::__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1aa12e);
      std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1aa13a);
      bVar1 = nuraft::raft_server::is_leader(in_stack_ffffffffffffe268);
      if (bVar1) {
        local_274 = 1;
        std::__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1aa6e0);
        std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1aa6ec);
        local_278 = nuraft::raft_server::get_leader(in_stack_ffffffffffffe268);
        if (local_274 == local_278) {
          local_2ac = 1;
          std::__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x1aac0e);
          std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1aac1a);
          local_2b0 = nuraft::raft_server::get_leader(in_stack_ffffffffffffe268);
          if (local_2ac == local_2b0) {
            for (local_2e8 = 0; local_2e8 < 10; local_2e8 = local_2e8 + 1) {
              std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe2a8);
              std::__cxx11::string::size();
              nuraft::buffer::alloc(in_stack_ffffffffffffe3b8);
              nuraft::buffer_serializer::buffer_serializer
                        ((buffer_serializer *)in_stack_ffffffffffffe280,
                         (ptr<buffer> *)in_stack_ffffffffffffe278,
                         (endianness)((ulong)in_stack_ffffffffffffe270 >> 0x20));
              nuraft::buffer_serializer::put_str
                        ((buffer_serializer *)in_stack_ffffffffffffe280,
                         (string *)in_stack_ffffffffffffe278);
              std::__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1ab1b6);
              std::
              __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1ab1c2);
              std::shared_ptr<nuraft::buffer>::shared_ptr
                        ((shared_ptr<nuraft::buffer> *)in_stack_ffffffffffffe270,
                         (shared_ptr<nuraft::buffer> *)in_stack_ffffffffffffe268);
              local_360 = 1;
              local_368 = (undefined1 **)local_378;
              std::allocator<std::shared_ptr<nuraft::buffer>_>::allocator
                        ((allocator<std::shared_ptr<nuraft::buffer>_> *)0x1ab218);
              __l_00._M_len = in_stack_ffffffffffffe2b0;
              __l_00._M_array = in_stack_ffffffffffffe2a8;
              std::
              vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
              ::vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                        *)in_stack_ffffffffffffe2a0,__l_00,
                       (allocator_type *)in_stack_ffffffffffffe298);
              nuraft::raft_server::append_entries
                        (in_stack_ffffffffffffe2d8,
                         (vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                          *)in_stack_ffffffffffffe2d0);
              std::
              shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
              ::~shared_ptr((shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                             *)0x1ab26b);
              std::
              vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
              ::~vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                         *)in_stack_ffffffffffffe280);
              std::allocator<std::shared_ptr<nuraft::buffer>_>::~allocator
                        ((allocator<std::shared_ptr<nuraft::buffer>_> *)0x1ab285);
              local_fd8 = &local_368;
              do {
                local_fd8 = local_fd8 + -2;
                std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x1ab2ba)
                ;
              } while (local_fd8 != local_378);
              std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x1ab2e4);
              std::__cxx11::string::~string(local_308);
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_3a0,"wait for replication",&local_3a1);
            TestSuite::sleep_sec
                      ((size_t)in_stack_ffffffffffffe270,(string *)in_stack_ffffffffffffe268);
            std::__cxx11::string::~string(local_3a0);
            std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
            std::__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )0x1ab461);
            RaftAsioPkg::getTestSm((RaftAsioPkg *)0x1ab469);
            std::__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )0x1ab480);
            pTVar6 = RaftAsioPkg::getTestSm((RaftAsioPkg *)0x1ab488);
            iVar2 = (int)pTVar6;
            bVar1 = raft_functional_common::TestSm::isSame
                              (in_stack_ffffffffffffe3c8,in_stack_ffffffffffffe3c0,
                               SUB81(in_stack_ffffffffffffe3b8 >> 0x38,0));
            if (bVar1) {
              std::__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1ab9f0);
              peVar7 = std::
                       __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x1ab9fc);
              nuraft::raft_server::shutdown(peVar7,iVar2,__how);
              std::__shared_ptr<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2>::reset
                        ((__shared_ptr<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2> *)
                         in_stack_ffffffffffffe280);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_3f8,"wait for quorum adjust",&local_3f9);
              TestSuite::sleep_ms((size_t)in_stack_ffffffffffffe270,
                                  (string *)in_stack_ffffffffffffe268);
              std::__cxx11::string::~string(local_3f8);
              std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
              std::__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1aba81);
              std::
              __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1aba8d);
              bVar1 = nuraft::raft_server::is_leader(in_stack_ffffffffffffe268);
              if (bVar1) {
                local_434 = 2;
                std::__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1abfe7);
                std::
                __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1abff3);
                local_438 = nuraft::raft_server::get_leader(in_stack_ffffffffffffe268);
                if (local_434 == local_438) {
                  std::__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1ac50a);
                  std::
                  __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1ac516);
                  local_470 = nuraft::raft_server::get_committed_log_idx(in_stack_ffffffffffffe278);
                  for (local_478 = 10; local_478 < 0xb; local_478 = local_478 + 1) {
                    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe2a8);
                    std::__cxx11::string::size();
                    nuraft::buffer::alloc(in_stack_ffffffffffffe3b8);
                    nuraft::buffer_serializer::buffer_serializer
                              ((buffer_serializer *)in_stack_ffffffffffffe280,
                               (ptr<buffer> *)in_stack_ffffffffffffe278,
                               (endianness)((ulong)in_stack_ffffffffffffe270 >> 0x20));
                    nuraft::buffer_serializer::put_str
                              ((buffer_serializer *)in_stack_ffffffffffffe280,
                               (string *)in_stack_ffffffffffffe278);
                    std::__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1ac5ca);
                    std::
                    __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1ac5d6);
                    std::shared_ptr<nuraft::buffer>::shared_ptr
                              ((shared_ptr<nuraft::buffer> *)in_stack_ffffffffffffe270,
                               (shared_ptr<nuraft::buffer> *)in_stack_ffffffffffffe268);
                    local_4f0 = 1;
                    local_4f8 = (undefined1 **)local_508;
                    std::allocator<std::shared_ptr<nuraft::buffer>_>::allocator
                              ((allocator<std::shared_ptr<nuraft::buffer>_> *)0x1ac62c);
                    __l_01._M_len = in_stack_ffffffffffffe2b0;
                    __l_01._M_array = in_stack_ffffffffffffe2a8;
                    std::
                    vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                    ::vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                              *)in_stack_ffffffffffffe2a0,__l_01,
                             (allocator_type *)in_stack_ffffffffffffe298);
                    nuraft::raft_server::append_entries
                              (in_stack_ffffffffffffe2d8,
                               (vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                                *)in_stack_ffffffffffffe2d0);
                    std::
                    shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                    ::~shared_ptr((shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                                   *)0x1ac67f);
                    std::
                    vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                    ::~vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                               *)in_stack_ffffffffffffe280);
                    std::allocator<std::shared_ptr<nuraft::buffer>_>::~allocator
                              ((allocator<std::shared_ptr<nuraft::buffer>_> *)0x1ac699);
                    local_13c0 = &local_4f8;
                    do {
                      local_13c0 = local_13c0 + -2;
                      std::shared_ptr<nuraft::buffer>::~shared_ptr
                                ((shared_ptr<nuraft::buffer> *)0x1ac6ce);
                    } while (local_13c0 != local_508);
                    std::shared_ptr<nuraft::buffer>::~shared_ptr
                              ((shared_ptr<nuraft::buffer> *)0x1ac6f8);
                    std::__cxx11::string::~string(local_498);
                  }
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_530,"wait for replication",&local_531);
                  TestSuite::sleep_sec
                            ((size_t)in_stack_ffffffffffffe270,(string *)in_stack_ffffffffffffe268);
                  std::__cxx11::string::~string(local_530);
                  std::allocator<char>::~allocator((allocator<char> *)&local_531);
                  local_540 = local_470 + 1;
                  std::__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1ac888);
                  std::
                  __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1ac894);
                  local_548 = nuraft::raft_server::get_committed_log_idx(in_stack_ffffffffffffe278);
                  if (local_540 == local_548) {
                    TestSuite::_msg("launching S1 again\n");
                    RaftAsioPkg::RaftAsioPkg
                              ((RaftAsioPkg *)in_stack_ffffffffffffe280,
                               (int)((ulong)in_stack_ffffffffffffe278 >> 0x20),
                               (string *)in_stack_ffffffffffffe270);
                    local_6d0 = local_698;
                    local_6c8 = &local_6d0;
                    local_6c0 = 1;
                    std::allocator<RaftAsioPkg_*>::allocator((allocator<RaftAsioPkg_*> *)0x1ace5b);
                    __l_02._M_len = in_stack_ffffffffffffe2b0;
                    __l_02._M_array = (iterator)in_stack_ffffffffffffe2a8;
                    std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::vector
                              (in_stack_ffffffffffffe2a0,__l_02,in_stack_ffffffffffffe298);
                    nuraft::raft_server::init_options::init_options
                              ((init_options *)in_stack_ffffffffffffe270);
                    iVar2 = launch_servers((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)
                                           CONCAT17(in_stack_ffffffffffffe45f,
                                                    in_stack_ffffffffffffe458),
                                           SUB81((ulong)in_stack_ffffffffffffe450 >> 0x38,0),
                                           SUB81((ulong)in_stack_ffffffffffffe450 >> 0x30,0),
                                           SUB81((ulong)in_stack_ffffffffffffe450 >> 0x28,0),
                                           in_stack_ffffffffffffe448);
                    nuraft::raft_server::init_options::~init_options((init_options *)0x1acec5);
                    std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::~vector
                              ((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)
                               in_stack_ffffffffffffe280);
                    std::allocator<RaftAsioPkg_*>::~allocator((allocator<RaftAsioPkg_*> *)0x1acedf);
                    local_69c = iVar2;
                    if (iVar2 == 0) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_758,"wait for S2 ready",&local_759);
                      TestSuite::sleep_sec
                                ((size_t)in_stack_ffffffffffffe270,
                                 (string *)in_stack_ffffffffffffe268);
                      std::__cxx11::string::~string(local_758);
                      std::allocator<char>::~allocator((allocator<char> *)&local_759);
                      local_768 = local_470 + 1;
                      std::
                      __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1ad4d9);
                      local_770 = nuraft::raft_server::get_committed_log_idx
                                            (in_stack_ffffffffffffe278);
                      if (local_768 == local_770) {
                        std::
                        __shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                        operator->((__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1ada40);
                        std::
                        __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x1ada4c);
                        bVar1 = nuraft::raft_server::is_leader(in_stack_ffffffffffffe268);
                        if (bVar1) {
                          local_7d4 = 2;
                          std::
                          __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x1adf5d);
                          local_7d8 = nuraft::raft_server::get_leader(in_stack_ffffffffffffe268);
                          if (local_7d4 == local_7d8) {
                            local_80c = 2;
                            std::
                            __shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)0x1ae47f);
                            std::
                            __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)0x1ae48b);
                            local_810 = nuraft::raft_server::get_leader(in_stack_ffffffffffffe268);
                            if (local_80c == local_810) {
                              for (local_848 = 0xb; local_848 < 0xc; local_848 = local_848 + 1) {
                                std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe2a8);
                                std::__cxx11::string::size();
                                nuraft::buffer::alloc(in_stack_ffffffffffffe3b8);
                                nuraft::buffer_serializer::buffer_serializer
                                          ((buffer_serializer *)in_stack_ffffffffffffe280,
                                           (ptr<buffer> *)in_stack_ffffffffffffe278,
                                           (endianness)((ulong)in_stack_ffffffffffffe270 >> 0x20));
                                nuraft::buffer_serializer::put_str
                                          ((buffer_serializer *)in_stack_ffffffffffffe280,
                                           (string *)in_stack_ffffffffffffe278);
                                std::
                                __shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)0x1aea27);
                                std::
                                __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)0x1aea33);
                                std::shared_ptr<nuraft::buffer>::shared_ptr
                                          ((shared_ptr<nuraft::buffer> *)in_stack_ffffffffffffe270,
                                           (shared_ptr<nuraft::buffer> *)in_stack_ffffffffffffe268);
                                local_8c0 = 1;
                                local_8c8 = (undefined1 **)local_8d8;
                                std::allocator<std::shared_ptr<nuraft::buffer>_>::allocator
                                          ((allocator<std::shared_ptr<nuraft::buffer>_> *)0x1aea89);
                                __l_03._M_len = in_stack_ffffffffffffe2b0;
                                __l_03._M_array = in_stack_ffffffffffffe2a8;
                                std::
                                vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                                ::vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                                          *)in_stack_ffffffffffffe2a0,__l_03,
                                         (allocator_type *)in_stack_ffffffffffffe298);
                                nuraft::raft_server::append_entries
                                          (in_stack_ffffffffffffe2d8,
                                           (vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                                            *)in_stack_ffffffffffffe2d0);
                                std::
                                shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                                ::~shared_ptr((shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                                               *)0x1aeadc);
                                std::
                                vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                                ::~vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                                           *)in_stack_ffffffffffffe280);
                                std::allocator<std::shared_ptr<nuraft::buffer>_>::~allocator
                                          ((allocator<std::shared_ptr<nuraft::buffer>_> *)0x1aeaf6);
                                local_1b10 = &local_8c8;
                                do {
                                  local_1b10 = local_1b10 + -2;
                                  std::shared_ptr<nuraft::buffer>::~shared_ptr
                                            ((shared_ptr<nuraft::buffer> *)0x1aeb2b);
                                } while (local_1b10 != local_8d8);
                                std::shared_ptr<nuraft::buffer>::~shared_ptr
                                          ((shared_ptr<nuraft::buffer> *)0x1aeb55);
                                std::__cxx11::string::~string(local_868);
                              }
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string
                                        (local_900,"wait for replication",&local_901);
                              iVar2 = (int)local_900;
                              TestSuite::sleep_sec
                                        ((size_t)in_stack_ffffffffffffe270,
                                         (string *)in_stack_ffffffffffffe268);
                              std::__cxx11::string::~string(local_900);
                              std::allocator<char>::~allocator((allocator<char> *)&local_901);
                              local_910 = local_470 + 2;
                              std::
                              __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)0x1aece6);
                              local_918 = nuraft::raft_server::get_committed_log_idx
                                                    (in_stack_ffffffffffffe278);
                              if (local_910 == local_918) {
                                local_950 = local_470 + 2;
                                std::
                                __shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)0x1af261);
                                std::
                                __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)0x1af26d);
                                local_958 = nuraft::raft_server::get_committed_log_idx
                                                      (in_stack_ffffffffffffe278);
                                if (local_950 == local_958) {
                                  std::
                                  __shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  ::operator->((__shared_ptr_access<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                *)0x1af731);
                                  peVar7 = std::
                                           __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           ::operator->((
                                                  __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)0x1af73d);
                                  nuraft::raft_server::shutdown(peVar7,iVar2,__how_00);
                                  peVar7 = std::
                                           __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           ::operator->((
                                                  __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)0x1af754);
                                  nuraft::raft_server::shutdown(peVar7,iVar2,__how_01);
                                  msg_00 = &local_9a9;
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string(local_9a8,"shutting down",msg_00);
                                  iVar2 = (int)local_9a8;
                                  TestSuite::sleep_sec
                                            ((size_t)in_stack_ffffffffffffe270,(string *)msg_00);
                                  std::__cxx11::string::~string(local_9a8);
                                  this = (allocator<char> *)&local_9a9;
                                  std::allocator<char>::~allocator(this);
                                  SimpleLogger::shutdown((int)this,iVar2);
                                  local_4 = 0;
                                }
                                else {
                                  poVar3 = (ostream *)
                                           std::ostream::operator<<
                                                     (&std::cout,
                                                      std::endl<char,std::char_traits<char>>);
                                  poVar3 = std::operator<<(poVar3,"        time: ");
                                  poVar3 = std::operator<<(poVar3,"\x1b[1;30m");
                                  TestSuite::getTimeString_abi_cxx11_();
                                  poVar3 = std::operator<<(poVar3,local_978);
                                  poVar3 = std::operator<<(poVar3,"\x1b[0m");
                                  poVar3 = std::operator<<(poVar3,"\n");
                                  poVar3 = std::operator<<(poVar3,"      thread: ");
                                  poVar3 = std::operator<<(poVar3,"\x1b[33m");
                                  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
                                  local_97c = (int)std::setw(4);
                                  poVar3 = std::operator<<(poVar3,(_Setw)local_97c);
                                  local_97d = (char)std::setfill<char>('0');
                                  poVar3 = std::operator<<(poVar3,local_97d);
                                  local_988 = (native_handle_type)std::this_thread::get_id();
                                  sVar4 = std::hash<std::thread::id>::operator()
                                                    ((hash<std::thread::id> *)
                                                     in_stack_ffffffffffffe270,
                                                     (id *)in_stack_ffffffffffffe268);
                                  pvVar5 = (void *)std::ostream::operator<<(poVar3,sVar4 & 0xffff);
                                  poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::dec);
                                  poVar3 = std::operator<<(poVar3,"\x1b[0m");
                                  poVar3 = std::operator<<(poVar3,"\n");
                                  poVar3 = std::operator<<(poVar3,"          in: ");
                                  poVar3 = std::operator<<(poVar3,"\x1b[36m");
                                  poVar3 = std::operator<<(poVar3,"auto_quorum_size_election_test");
                                  poVar3 = std::operator<<(poVar3,"()\x1b[0m");
                                  poVar3 = std::operator<<(poVar3,"\n");
                                  poVar3 = std::operator<<(poVar3,"          at: ");
                                  poVar3 = std::operator<<(poVar3,"\x1b[32m");
                                  poVar3 = std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                                  );
                                  poVar3 = std::operator<<(poVar3,"\x1b[0m:");
                                  poVar3 = std::operator<<(poVar3,"\x1b[1;35m");
                                  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x44d);
                                  poVar3 = std::operator<<(poVar3,"\x1b[0m");
                                  poVar3 = std::operator<<(poVar3,"\n");
                                  poVar3 = std::operator<<(poVar3,
                                                  "    value of: \x1b[1;34ms2->raftServer->get_committed_log_idx()\x1b[0m\n"
                                                  );
                                  poVar3 = std::operator<<(poVar3,"    expected: \x1b[1;32m");
                                  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_950);
                                  in_stack_ffffffffffffe280 =
                                       (raft_server *)std::operator<<(poVar3,"\x1b[0m\n");
                                  poVar3 = std::operator<<((ostream *)in_stack_ffffffffffffe280,
                                                           "      actual: \x1b[1;31m");
                                  in_stack_ffffffffffffe270 =
                                       (RaftAsioPkg *)std::ostream::operator<<(poVar3,local_958);
                                  std::operator<<((ostream *)in_stack_ffffffffffffe270,"\x1b[0m\n");
                                  std::__cxx11::string::~string(local_978);
                                  TestSuite::failHandler();
                                  local_4 = -1;
                                }
                              }
                              else {
                                poVar3 = (ostream *)
                                         std::ostream::operator<<
                                                   (&std::cout,
                                                    std::endl<char,std::char_traits<char>>);
                                poVar3 = std::operator<<(poVar3,"        time: ");
                                poVar3 = std::operator<<(poVar3,"\x1b[1;30m");
                                TestSuite::getTimeString_abi_cxx11_();
                                poVar3 = std::operator<<(poVar3,local_938);
                                poVar3 = std::operator<<(poVar3,"\x1b[0m");
                                poVar3 = std::operator<<(poVar3,"\n");
                                poVar3 = std::operator<<(poVar3,"      thread: ");
                                poVar3 = std::operator<<(poVar3,"\x1b[33m");
                                poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
                                local_93c = (int)std::setw(4);
                                poVar3 = std::operator<<(poVar3,(_Setw)local_93c);
                                local_93d = (char)std::setfill<char>('0');
                                poVar3 = std::operator<<(poVar3,local_93d);
                                local_948 = (native_handle_type)std::this_thread::get_id();
                                sVar4 = std::hash<std::thread::id>::operator()
                                                  ((hash<std::thread::id> *)
                                                   in_stack_ffffffffffffe270,
                                                   (id *)in_stack_ffffffffffffe268);
                                pvVar5 = (void *)std::ostream::operator<<(poVar3,sVar4 & 0xffff);
                                poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::dec);
                                poVar3 = std::operator<<(poVar3,"\x1b[0m");
                                poVar3 = std::operator<<(poVar3,"\n");
                                poVar3 = std::operator<<(poVar3,"          in: ");
                                poVar3 = std::operator<<(poVar3,"\x1b[36m");
                                poVar3 = std::operator<<(poVar3,"auto_quorum_size_election_test");
                                poVar3 = std::operator<<(poVar3,"()\x1b[0m");
                                poVar3 = std::operator<<(poVar3,"\n");
                                poVar3 = std::operator<<(poVar3,"          at: ");
                                poVar3 = std::operator<<(poVar3,"\x1b[32m");
                                poVar3 = std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                                  );
                                poVar3 = std::operator<<(poVar3,"\x1b[0m:");
                                poVar3 = std::operator<<(poVar3,"\x1b[1;35m");
                                poVar3 = (ostream *)std::ostream::operator<<(poVar3,1099);
                                poVar3 = std::operator<<(poVar3,"\x1b[0m");
                                poVar3 = std::operator<<(poVar3,"\n");
                                poVar3 = std::operator<<(poVar3,
                                                  "    value of: \x1b[1;34ms1_new.raftServer->get_committed_log_idx()\x1b[0m\n"
                                                  );
                                poVar3 = std::operator<<(poVar3,"    expected: \x1b[1;32m");
                                poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_910);
                                poVar3 = std::operator<<(poVar3,"\x1b[0m\n");
                                poVar3 = std::operator<<(poVar3,"      actual: \x1b[1;31m");
                                poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_918);
                                std::operator<<(poVar3,"\x1b[0m\n");
                                std::__cxx11::string::~string(local_938);
                                TestSuite::failHandler();
                                local_4 = -1;
                              }
                            }
                            else {
                              poVar3 = (ostream *)
                                       std::ostream::operator<<
                                                 (&std::cout,std::endl<char,std::char_traits<char>>)
                              ;
                              poVar3 = std::operator<<(poVar3,"        time: ");
                              poVar3 = std::operator<<(poVar3,"\x1b[1;30m");
                              TestSuite::getTimeString_abi_cxx11_();
                              poVar3 = std::operator<<(poVar3,local_830);
                              poVar3 = std::operator<<(poVar3,"\x1b[0m");
                              poVar3 = std::operator<<(poVar3,"\n");
                              poVar3 = std::operator<<(poVar3,"      thread: ");
                              poVar3 = std::operator<<(poVar3,"\x1b[33m");
                              poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
                              local_834 = (int)std::setw(4);
                              poVar3 = std::operator<<(poVar3,(_Setw)local_834);
                              local_835 = (char)std::setfill<char>('0');
                              poVar3 = std::operator<<(poVar3,local_835);
                              local_840 = (native_handle_type)std::this_thread::get_id();
                              sVar4 = std::hash<std::thread::id>::operator()
                                                ((hash<std::thread::id> *)in_stack_ffffffffffffe270,
                                                 (id *)in_stack_ffffffffffffe268);
                              pvVar5 = (void *)std::ostream::operator<<(poVar3,sVar4 & 0xffff);
                              poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::dec);
                              poVar3 = std::operator<<(poVar3,"\x1b[0m");
                              poVar3 = std::operator<<(poVar3,"\n");
                              poVar3 = std::operator<<(poVar3,"          in: ");
                              poVar3 = std::operator<<(poVar3,"\x1b[36m");
                              poVar3 = std::operator<<(poVar3,"auto_quorum_size_election_test");
                              poVar3 = std::operator<<(poVar3,"()\x1b[0m");
                              poVar3 = std::operator<<(poVar3,"\n");
                              poVar3 = std::operator<<(poVar3,"          at: ");
                              poVar3 = std::operator<<(poVar3,"\x1b[32m");
                              poVar3 = std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                                  );
                              poVar3 = std::operator<<(poVar3,"\x1b[0m:");
                              poVar3 = std::operator<<(poVar3,"\x1b[1;35m");
                              poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x43d);
                              poVar3 = std::operator<<(poVar3,"\x1b[0m");
                              poVar3 = std::operator<<(poVar3,"\n");
                              poVar3 = std::operator<<(poVar3,
                                                  "    value of: \x1b[1;34ms2->raftServer->get_leader()\x1b[0m\n"
                                                  );
                              poVar3 = std::operator<<(poVar3,"    expected: \x1b[1;32m");
                              poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_80c);
                              poVar3 = std::operator<<(poVar3,"\x1b[0m\n");
                              poVar3 = std::operator<<(poVar3,"      actual: \x1b[1;31m");
                              poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_810);
                              std::operator<<(poVar3,"\x1b[0m\n");
                              std::__cxx11::string::~string(local_830);
                              TestSuite::failHandler();
                              local_4 = -1;
                            }
                          }
                          else {
                            poVar3 = (ostream *)
                                     std::ostream::operator<<
                                               (&std::cout,std::endl<char,std::char_traits<char>>);
                            poVar3 = std::operator<<(poVar3,"        time: ");
                            poVar3 = std::operator<<(poVar3,"\x1b[1;30m");
                            TestSuite::getTimeString_abi_cxx11_();
                            poVar3 = std::operator<<(poVar3,local_7f8);
                            poVar3 = std::operator<<(poVar3,"\x1b[0m");
                            poVar3 = std::operator<<(poVar3,"\n");
                            poVar3 = std::operator<<(poVar3,"      thread: ");
                            poVar3 = std::operator<<(poVar3,"\x1b[33m");
                            poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
                            local_7fc = (int)std::setw(4);
                            poVar3 = std::operator<<(poVar3,(_Setw)local_7fc);
                            local_7fd = (char)std::setfill<char>('0');
                            poVar3 = std::operator<<(poVar3,local_7fd);
                            local_808 = (native_handle_type)std::this_thread::get_id();
                            sVar4 = std::hash<std::thread::id>::operator()
                                              ((hash<std::thread::id> *)in_stack_ffffffffffffe270,
                                               (id *)in_stack_ffffffffffffe268);
                            pvVar5 = (void *)std::ostream::operator<<(poVar3,sVar4 & 0xffff);
                            poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::dec);
                            poVar3 = std::operator<<(poVar3,"\x1b[0m");
                            poVar3 = std::operator<<(poVar3,"\n");
                            poVar3 = std::operator<<(poVar3,"          in: ");
                            poVar3 = std::operator<<(poVar3,"\x1b[36m");
                            poVar3 = std::operator<<(poVar3,"auto_quorum_size_election_test");
                            poVar3 = std::operator<<(poVar3,"()\x1b[0m");
                            poVar3 = std::operator<<(poVar3,"\n");
                            poVar3 = std::operator<<(poVar3,"          at: ");
                            poVar3 = std::operator<<(poVar3,"\x1b[32m");
                            poVar3 = std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                                  );
                            poVar3 = std::operator<<(poVar3,"\x1b[0m:");
                            poVar3 = std::operator<<(poVar3,"\x1b[1;35m");
                            poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x43c);
                            poVar3 = std::operator<<(poVar3,"\x1b[0m");
                            poVar3 = std::operator<<(poVar3,"\n");
                            poVar3 = std::operator<<(poVar3,
                                                  "    value of: \x1b[1;34ms1_new.raftServer->get_leader()\x1b[0m\n"
                                                  );
                            poVar3 = std::operator<<(poVar3,"    expected: \x1b[1;32m");
                            poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_7d4);
                            poVar3 = std::operator<<(poVar3,"\x1b[0m\n");
                            poVar3 = std::operator<<(poVar3,"      actual: \x1b[1;31m");
                            poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_7d8);
                            std::operator<<(poVar3,"\x1b[0m\n");
                            std::__cxx11::string::~string(local_7f8);
                            TestSuite::failHandler();
                            local_4 = -1;
                          }
                        }
                        else {
                          poVar3 = (ostream *)
                                   std::ostream::operator<<
                                             (&std::cout,std::endl<char,std::char_traits<char>>);
                          poVar3 = std::operator<<(poVar3,"        time: ");
                          poVar3 = std::operator<<(poVar3,"\x1b[1;30m");
                          TestSuite::getTimeString_abi_cxx11_();
                          poVar3 = std::operator<<(poVar3,local_7c0);
                          poVar3 = std::operator<<(poVar3,"\x1b[0m");
                          poVar3 = std::operator<<(poVar3,"\n");
                          poVar3 = std::operator<<(poVar3,"      thread: ");
                          poVar3 = std::operator<<(poVar3,"\x1b[33m");
                          poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
                          local_7c4 = (int)std::setw(4);
                          poVar3 = std::operator<<(poVar3,(_Setw)local_7c4);
                          local_7c5 = (char)std::setfill<char>('0');
                          poVar3 = std::operator<<(poVar3,local_7c5);
                          local_7d0 = (native_handle_type)std::this_thread::get_id();
                          sVar4 = std::hash<std::thread::id>::operator()
                                            ((hash<std::thread::id> *)in_stack_ffffffffffffe270,
                                             (id *)in_stack_ffffffffffffe268);
                          pvVar5 = (void *)std::ostream::operator<<(poVar3,sVar4 & 0xffff);
                          poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::dec);
                          poVar3 = std::operator<<(poVar3,"\x1b[0m");
                          poVar3 = std::operator<<(poVar3,"\n");
                          poVar3 = std::operator<<(poVar3,"          in: ");
                          poVar3 = std::operator<<(poVar3,"\x1b[36m");
                          poVar3 = std::operator<<(poVar3,"auto_quorum_size_election_test");
                          poVar3 = std::operator<<(poVar3,"()\x1b[0m");
                          poVar3 = std::operator<<(poVar3,"\n");
                          poVar3 = std::operator<<(poVar3,"          at: ");
                          poVar3 = std::operator<<(poVar3,"\x1b[32m");
                          poVar3 = std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                                  );
                          poVar3 = std::operator<<(poVar3,"\x1b[0m:");
                          poVar3 = std::operator<<(poVar3,"\x1b[1;35m");
                          poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x43b);
                          poVar3 = std::operator<<(poVar3,"\x1b[0m");
                          poVar3 = std::operator<<(poVar3,"\n");
                          poVar3 = std::operator<<(poVar3,
                                                  "    value of: \x1b[1;34ms2->raftServer->is_leader()\x1b[0m\n"
                                                  );
                          poVar3 = std::operator<<(poVar3,"    expected: \x1b[1;32m");
                          poVar3 = std::operator<<(poVar3,"true");
                          poVar3 = std::operator<<(poVar3,"\x1b[0m\n");
                          poVar3 = std::operator<<(poVar3,"      actual: \x1b[1;31m");
                          poVar3 = std::operator<<(poVar3,"false");
                          std::operator<<(poVar3,"\x1b[0m\n");
                          std::__cxx11::string::~string(local_7c0);
                          TestSuite::failHandler();
                          local_4 = -1;
                        }
                      }
                      else {
                        poVar3 = (ostream *)
                                 std::ostream::operator<<
                                           (&std::cout,std::endl<char,std::char_traits<char>>);
                        poVar3 = std::operator<<(poVar3,"        time: ");
                        poVar3 = std::operator<<(poVar3,"\x1b[1;30m");
                        TestSuite::getTimeString_abi_cxx11_();
                        poVar3 = std::operator<<(poVar3,local_790);
                        poVar3 = std::operator<<(poVar3,"\x1b[0m");
                        poVar3 = std::operator<<(poVar3,"\n");
                        poVar3 = std::operator<<(poVar3,"      thread: ");
                        poVar3 = std::operator<<(poVar3,"\x1b[33m");
                        poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
                        local_794 = (int)std::setw(4);
                        poVar3 = std::operator<<(poVar3,(_Setw)local_794);
                        local_795 = (char)std::setfill<char>('0');
                        poVar3 = std::operator<<(poVar3,local_795);
                        local_7a0 = (native_handle_type)std::this_thread::get_id();
                        sVar4 = std::hash<std::thread::id>::operator()
                                          ((hash<std::thread::id> *)in_stack_ffffffffffffe270,
                                           (id *)in_stack_ffffffffffffe268);
                        pvVar5 = (void *)std::ostream::operator<<(poVar3,sVar4 & 0xffff);
                        poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::dec);
                        poVar3 = std::operator<<(poVar3,"\x1b[0m");
                        poVar3 = std::operator<<(poVar3,"\n");
                        poVar3 = std::operator<<(poVar3,"          in: ");
                        poVar3 = std::operator<<(poVar3,"\x1b[36m");
                        poVar3 = std::operator<<(poVar3,"auto_quorum_size_election_test");
                        poVar3 = std::operator<<(poVar3,"()\x1b[0m");
                        poVar3 = std::operator<<(poVar3,"\n");
                        poVar3 = std::operator<<(poVar3,"          at: ");
                        poVar3 = std::operator<<(poVar3,"\x1b[32m");
                        poVar3 = std::operator<<(poVar3,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                                );
                        poVar3 = std::operator<<(poVar3,"\x1b[0m:");
                        poVar3 = std::operator<<(poVar3,"\x1b[1;35m");
                        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x438);
                        poVar3 = std::operator<<(poVar3,"\x1b[0m");
                        poVar3 = std::operator<<(poVar3,"\n");
                        poVar3 = std::operator<<(poVar3,
                                                 "    value of: \x1b[1;34ms1_new.raftServer->get_committed_log_idx()\x1b[0m\n"
                                                );
                        poVar3 = std::operator<<(poVar3,"    expected: \x1b[1;32m");
                        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_768);
                        poVar3 = std::operator<<(poVar3,"\x1b[0m\n");
                        poVar3 = std::operator<<(poVar3,"      actual: \x1b[1;31m");
                        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_770);
                        std::operator<<(poVar3,"\x1b[0m\n");
                        std::__cxx11::string::~string(local_790);
                        TestSuite::failHandler();
                        local_4 = -1;
                      }
                    }
                    else {
                      poVar3 = (ostream *)
                               std::ostream::operator<<
                                         (&std::cout,std::endl<char,std::char_traits<char>>);
                      poVar3 = std::operator<<(poVar3,"        time: ");
                      poVar3 = std::operator<<(poVar3,"\x1b[1;30m");
                      TestSuite::getTimeString_abi_cxx11_();
                      poVar3 = std::operator<<(poVar3,local_728);
                      poVar3 = std::operator<<(poVar3,"\x1b[0m");
                      poVar3 = std::operator<<(poVar3,"\n");
                      poVar3 = std::operator<<(poVar3,"      thread: ");
                      poVar3 = std::operator<<(poVar3,"\x1b[33m");
                      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
                      local_72c = (int)std::setw(4);
                      poVar3 = std::operator<<(poVar3,(_Setw)local_72c);
                      local_72d = (char)std::setfill<char>('0');
                      poVar3 = std::operator<<(poVar3,local_72d);
                      local_738 = (native_handle_type)std::this_thread::get_id();
                      sVar4 = std::hash<std::thread::id>::operator()
                                        ((hash<std::thread::id> *)in_stack_ffffffffffffe270,
                                         (id *)in_stack_ffffffffffffe268);
                      pvVar5 = (void *)std::ostream::operator<<(poVar3,sVar4 & 0xffff);
                      poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::dec);
                      poVar3 = std::operator<<(poVar3,"\x1b[0m");
                      poVar3 = std::operator<<(poVar3,"\n");
                      poVar3 = std::operator<<(poVar3,"          in: ");
                      poVar3 = std::operator<<(poVar3,"\x1b[36m");
                      poVar3 = std::operator<<(poVar3,"auto_quorum_size_election_test");
                      poVar3 = std::operator<<(poVar3,"()\x1b[0m");
                      poVar3 = std::operator<<(poVar3,"\n");
                      poVar3 = std::operator<<(poVar3,"          at: ");
                      poVar3 = std::operator<<(poVar3,"\x1b[32m");
                      poVar3 = std::operator<<(poVar3,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                              );
                      poVar3 = std::operator<<(poVar3,"\x1b[0m:");
                      poVar3 = std::operator<<(poVar3,"\x1b[1;35m");
                      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x435);
                      poVar3 = std::operator<<(poVar3,"\x1b[0m");
                      poVar3 = std::operator<<(poVar3,"\n");
                      poVar3 = std::operator<<(poVar3,
                                               "    value of: \x1b[1;34mlaunch_servers({&s1_new}, false)\x1b[0m\n"
                                              );
                      poVar3 = std::operator<<(poVar3,"    expected: \x1b[1;32m");
                      poVar3 = std::operator<<(poVar3,"0");
                      poVar3 = std::operator<<(poVar3,"\x1b[0m\n");
                      poVar3 = std::operator<<(poVar3,"      actual: \x1b[1;31m");
                      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_69c);
                      std::operator<<(poVar3,"\x1b[0m\n");
                      std::__cxx11::string::~string(local_728);
                      TestSuite::failHandler();
                      local_4 = -1;
                    }
                    local_13c = 1;
                    RaftAsioPkg::~RaftAsioPkg(in_stack_ffffffffffffe270);
                  }
                  else {
                    poVar3 = (ostream *)
                             std::ostream::operator<<
                                       (&std::cout,std::endl<char,std::char_traits<char>>);
                    poVar3 = std::operator<<(poVar3,"        time: ");
                    poVar3 = std::operator<<(poVar3,"\x1b[1;30m");
                    TestSuite::getTimeString_abi_cxx11_();
                    poVar3 = std::operator<<(poVar3,local_568);
                    poVar3 = std::operator<<(poVar3,"\x1b[0m");
                    poVar3 = std::operator<<(poVar3,"\n");
                    poVar3 = std::operator<<(poVar3,"      thread: ");
                    poVar3 = std::operator<<(poVar3,"\x1b[33m");
                    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
                    local_56c = (int)std::setw(4);
                    poVar3 = std::operator<<(poVar3,(_Setw)local_56c);
                    local_56d = (char)std::setfill<char>('0');
                    poVar3 = std::operator<<(poVar3,local_56d);
                    local_578 = (native_handle_type)std::this_thread::get_id();
                    sVar4 = std::hash<std::thread::id>::operator()
                                      ((hash<std::thread::id> *)in_stack_ffffffffffffe270,
                                       (id *)in_stack_ffffffffffffe268);
                    pvVar5 = (void *)std::ostream::operator<<(poVar3,sVar4 & 0xffff);
                    poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::dec);
                    poVar3 = std::operator<<(poVar3,"\x1b[0m");
                    poVar3 = std::operator<<(poVar3,"\n");
                    poVar3 = std::operator<<(poVar3,"          in: ");
                    poVar3 = std::operator<<(poVar3,"\x1b[36m");
                    poVar3 = std::operator<<(poVar3,"auto_quorum_size_election_test");
                    poVar3 = std::operator<<(poVar3,"()\x1b[0m");
                    poVar3 = std::operator<<(poVar3,"\n");
                    poVar3 = std::operator<<(poVar3,"          at: ");
                    poVar3 = std::operator<<(poVar3,"\x1b[32m");
                    poVar3 = std::operator<<(poVar3,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                            );
                    poVar3 = std::operator<<(poVar3,"\x1b[0m:");
                    poVar3 = std::operator<<(poVar3,"\x1b[1;35m");
                    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x430);
                    poVar3 = std::operator<<(poVar3,"\x1b[0m");
                    poVar3 = std::operator<<(poVar3,"\n");
                    poVar3 = std::operator<<(poVar3,
                                             "    value of: \x1b[1;34ms2->raftServer->get_committed_log_idx()\x1b[0m\n"
                                            );
                    poVar3 = std::operator<<(poVar3,"    expected: \x1b[1;32m");
                    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_540);
                    poVar3 = std::operator<<(poVar3,"\x1b[0m\n");
                    poVar3 = std::operator<<(poVar3,"      actual: \x1b[1;31m");
                    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_548);
                    std::operator<<(poVar3,"\x1b[0m\n");
                    std::__cxx11::string::~string(local_568);
                    TestSuite::failHandler();
                    local_4 = -1;
                    local_13c = 1;
                  }
                }
                else {
                  poVar3 = (ostream *)
                           std::ostream::operator<<
                                     (&std::cout,std::endl<char,std::char_traits<char>>);
                  poVar3 = std::operator<<(poVar3,"        time: ");
                  poVar3 = std::operator<<(poVar3,"\x1b[1;30m");
                  TestSuite::getTimeString_abi_cxx11_();
                  poVar3 = std::operator<<(poVar3,local_458);
                  poVar3 = std::operator<<(poVar3,"\x1b[0m");
                  poVar3 = std::operator<<(poVar3,"\n");
                  poVar3 = std::operator<<(poVar3,"      thread: ");
                  poVar3 = std::operator<<(poVar3,"\x1b[33m");
                  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
                  local_45c = (int)std::setw(4);
                  poVar3 = std::operator<<(poVar3,(_Setw)local_45c);
                  local_45d = (char)std::setfill<char>('0');
                  poVar3 = std::operator<<(poVar3,local_45d);
                  local_468 = (native_handle_type)std::this_thread::get_id();
                  sVar4 = std::hash<std::thread::id>::operator()
                                    ((hash<std::thread::id> *)in_stack_ffffffffffffe270,
                                     (id *)in_stack_ffffffffffffe268);
                  pvVar5 = (void *)std::ostream::operator<<(poVar3,sVar4 & 0xffff);
                  poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::dec);
                  poVar3 = std::operator<<(poVar3,"\x1b[0m");
                  poVar3 = std::operator<<(poVar3,"\n");
                  poVar3 = std::operator<<(poVar3,"          in: ");
                  poVar3 = std::operator<<(poVar3,"\x1b[36m");
                  poVar3 = std::operator<<(poVar3,"auto_quorum_size_election_test");
                  poVar3 = std::operator<<(poVar3,"()\x1b[0m");
                  poVar3 = std::operator<<(poVar3,"\n");
                  poVar3 = std::operator<<(poVar3,"          at: ");
                  poVar3 = std::operator<<(poVar3,"\x1b[32m");
                  poVar3 = std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                          );
                  poVar3 = std::operator<<(poVar3,"\x1b[0m:");
                  poVar3 = std::operator<<(poVar3,"\x1b[1;35m");
                  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x421);
                  poVar3 = std::operator<<(poVar3,"\x1b[0m");
                  poVar3 = std::operator<<(poVar3,"\n");
                  poVar3 = std::operator<<(poVar3,
                                           "    value of: \x1b[1;34ms2->raftServer->get_leader()\x1b[0m\n"
                                          );
                  poVar3 = std::operator<<(poVar3,"    expected: \x1b[1;32m");
                  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_434);
                  poVar3 = std::operator<<(poVar3,"\x1b[0m\n");
                  poVar3 = std::operator<<(poVar3,"      actual: \x1b[1;31m");
                  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_438);
                  std::operator<<(poVar3,"\x1b[0m\n");
                  std::__cxx11::string::~string(local_458);
                  TestSuite::failHandler();
                  local_4 = -1;
                  local_13c = 1;
                }
              }
              else {
                poVar3 = (ostream *)
                         std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>)
                ;
                poVar3 = std::operator<<(poVar3,"        time: ");
                poVar3 = std::operator<<(poVar3,"\x1b[1;30m");
                TestSuite::getTimeString_abi_cxx11_();
                poVar3 = std::operator<<(poVar3,local_420);
                poVar3 = std::operator<<(poVar3,"\x1b[0m");
                poVar3 = std::operator<<(poVar3,"\n");
                poVar3 = std::operator<<(poVar3,"      thread: ");
                poVar3 = std::operator<<(poVar3,"\x1b[33m");
                poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
                local_424 = (int)std::setw(4);
                poVar3 = std::operator<<(poVar3,(_Setw)local_424);
                local_425 = (char)std::setfill<char>('0');
                poVar3 = std::operator<<(poVar3,local_425);
                local_430 = (native_handle_type)std::this_thread::get_id();
                sVar4 = std::hash<std::thread::id>::operator()
                                  ((hash<std::thread::id> *)in_stack_ffffffffffffe270,
                                   (id *)in_stack_ffffffffffffe268);
                pvVar5 = (void *)std::ostream::operator<<(poVar3,sVar4 & 0xffff);
                poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::dec);
                poVar3 = std::operator<<(poVar3,"\x1b[0m");
                poVar3 = std::operator<<(poVar3,"\n");
                poVar3 = std::operator<<(poVar3,"          in: ");
                poVar3 = std::operator<<(poVar3,"\x1b[36m");
                poVar3 = std::operator<<(poVar3,"auto_quorum_size_election_test");
                poVar3 = std::operator<<(poVar3,"()\x1b[0m");
                poVar3 = std::operator<<(poVar3,"\n");
                poVar3 = std::operator<<(poVar3,"          at: ");
                poVar3 = std::operator<<(poVar3,"\x1b[32m");
                poVar3 = std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                        );
                poVar3 = std::operator<<(poVar3,"\x1b[0m:");
                poVar3 = std::operator<<(poVar3,"\x1b[1;35m");
                poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x420);
                poVar3 = std::operator<<(poVar3,"\x1b[0m");
                poVar3 = std::operator<<(poVar3,"\n");
                poVar3 = std::operator<<(poVar3,
                                         "    value of: \x1b[1;34ms2->raftServer->is_leader()\x1b[0m\n"
                                        );
                poVar3 = std::operator<<(poVar3,"    expected: \x1b[1;32m");
                poVar3 = std::operator<<(poVar3,"true");
                poVar3 = std::operator<<(poVar3,"\x1b[0m\n");
                poVar3 = std::operator<<(poVar3,"      actual: \x1b[1;31m");
                poVar3 = std::operator<<(poVar3,"false");
                std::operator<<(poVar3,"\x1b[0m\n");
                std::__cxx11::string::~string(local_420);
                TestSuite::failHandler();
                local_4 = -1;
                local_13c = 1;
              }
            }
            else {
              poVar3 = (ostream *)
                       std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
              poVar3 = std::operator<<(poVar3,"        time: ");
              poVar3 = std::operator<<(poVar3,"\x1b[1;30m");
              TestSuite::getTimeString_abi_cxx11_();
              poVar3 = std::operator<<(poVar3,local_3c8);
              poVar3 = std::operator<<(poVar3,"\x1b[0m");
              poVar3 = std::operator<<(poVar3,"\n");
              poVar3 = std::operator<<(poVar3,"      thread: ");
              poVar3 = std::operator<<(poVar3,"\x1b[33m");
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
              local_3cc = (int)std::setw(4);
              poVar3 = std::operator<<(poVar3,(_Setw)local_3cc);
              local_3cd = (char)std::setfill<char>('0');
              poVar3 = std::operator<<(poVar3,local_3cd);
              local_3d8 = (native_handle_type)std::this_thread::get_id();
              sVar4 = std::hash<std::thread::id>::operator()
                                ((hash<std::thread::id> *)in_stack_ffffffffffffe270,
                                 (id *)in_stack_ffffffffffffe268);
              pvVar5 = (void *)std::ostream::operator<<(poVar3,sVar4 & 0xffff);
              poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::dec);
              poVar3 = std::operator<<(poVar3,"\x1b[0m");
              poVar3 = std::operator<<(poVar3,"\n");
              poVar3 = std::operator<<(poVar3,"          in: ");
              poVar3 = std::operator<<(poVar3,"\x1b[36m");
              poVar3 = std::operator<<(poVar3,"auto_quorum_size_election_test");
              poVar3 = std::operator<<(poVar3,"()\x1b[0m");
              poVar3 = std::operator<<(poVar3,"\n");
              poVar3 = std::operator<<(poVar3,"          at: ");
              poVar3 = std::operator<<(poVar3,"\x1b[32m");
              poVar3 = std::operator<<(poVar3,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                      );
              poVar3 = std::operator<<(poVar3,"\x1b[0m:");
              poVar3 = std::operator<<(poVar3,"\x1b[1;35m");
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x415);
              poVar3 = std::operator<<(poVar3,"\x1b[0m");
              poVar3 = std::operator<<(poVar3,"\n");
              poVar3 = std::operator<<(poVar3,
                                       "    value of: \x1b[1;34ms2->getTestSm()->isSame( *s1->getTestSm() )\x1b[0m\n"
                                      );
              poVar3 = std::operator<<(poVar3,"    expected: \x1b[1;32m");
              poVar3 = std::operator<<(poVar3,"true");
              poVar3 = std::operator<<(poVar3,"\x1b[0m\n");
              poVar3 = std::operator<<(poVar3,"      actual: \x1b[1;31m");
              poVar3 = std::operator<<(poVar3,"false");
              std::operator<<(poVar3,"\x1b[0m\n");
              std::__cxx11::string::~string(local_3c8);
              TestSuite::failHandler();
              local_4 = -1;
              local_13c = 1;
            }
          }
          else {
            poVar3 = (ostream *)
                     std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
            poVar3 = std::operator<<(poVar3,"        time: ");
            poVar3 = std::operator<<(poVar3,"\x1b[1;30m");
            TestSuite::getTimeString_abi_cxx11_();
            poVar3 = std::operator<<(poVar3,local_2d0);
            poVar3 = std::operator<<(poVar3,"\x1b[0m");
            poVar3 = std::operator<<(poVar3,"\n");
            poVar3 = std::operator<<(poVar3,"      thread: ");
            poVar3 = std::operator<<(poVar3,"\x1b[33m");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
            local_2d4 = (int)std::setw(4);
            poVar3 = std::operator<<(poVar3,(_Setw)local_2d4);
            local_2d5 = (char)std::setfill<char>('0');
            poVar3 = std::operator<<(poVar3,local_2d5);
            local_2e0 = (native_handle_type)std::this_thread::get_id();
            sVar4 = std::hash<std::thread::id>::operator()
                              ((hash<std::thread::id> *)in_stack_ffffffffffffe270,
                               (id *)in_stack_ffffffffffffe268);
            pvVar5 = (void *)std::ostream::operator<<(poVar3,sVar4 & 0xffff);
            poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::dec);
            poVar3 = std::operator<<(poVar3,"\x1b[0m");
            poVar3 = std::operator<<(poVar3,"\n");
            poVar3 = std::operator<<(poVar3,"          in: ");
            poVar3 = std::operator<<(poVar3,"\x1b[36m");
            poVar3 = std::operator<<(poVar3,"auto_quorum_size_election_test");
            poVar3 = std::operator<<(poVar3,"()\x1b[0m");
            poVar3 = std::operator<<(poVar3,"\n");
            poVar3 = std::operator<<(poVar3,"          at: ");
            poVar3 = std::operator<<(poVar3,"\x1b[32m");
            poVar3 = std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                    );
            poVar3 = std::operator<<(poVar3,"\x1b[0m:");
            poVar3 = std::operator<<(poVar3,"\x1b[1;35m");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x408);
            poVar3 = std::operator<<(poVar3,"\x1b[0m");
            poVar3 = std::operator<<(poVar3,"\n");
            poVar3 = std::operator<<(poVar3,
                                     "    value of: \x1b[1;34ms2->raftServer->get_leader()\x1b[0m\n"
                                    );
            poVar3 = std::operator<<(poVar3,"    expected: \x1b[1;32m");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_2ac);
            poVar3 = std::operator<<(poVar3,"\x1b[0m\n");
            poVar3 = std::operator<<(poVar3,"      actual: \x1b[1;31m");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_2b0);
            std::operator<<(poVar3,"\x1b[0m\n");
            std::__cxx11::string::~string(local_2d0);
            TestSuite::failHandler();
            local_4 = -1;
            local_13c = 1;
          }
        }
        else {
          poVar3 = (ostream *)
                   std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
          poVar3 = std::operator<<(poVar3,"        time: ");
          poVar3 = std::operator<<(poVar3,"\x1b[1;30m");
          TestSuite::getTimeString_abi_cxx11_();
          poVar3 = std::operator<<(poVar3,local_298);
          poVar3 = std::operator<<(poVar3,"\x1b[0m");
          poVar3 = std::operator<<(poVar3,"\n");
          poVar3 = std::operator<<(poVar3,"      thread: ");
          poVar3 = std::operator<<(poVar3,"\x1b[33m");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
          local_29c = (int)std::setw(4);
          poVar3 = std::operator<<(poVar3,(_Setw)local_29c);
          local_29d = (char)std::setfill<char>('0');
          poVar3 = std::operator<<(poVar3,local_29d);
          local_2a8 = (native_handle_type)std::this_thread::get_id();
          sVar4 = std::hash<std::thread::id>::operator()
                            ((hash<std::thread::id> *)in_stack_ffffffffffffe270,
                             (id *)in_stack_ffffffffffffe268);
          pvVar5 = (void *)std::ostream::operator<<(poVar3,sVar4 & 0xffff);
          poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::dec);
          poVar3 = std::operator<<(poVar3,"\x1b[0m");
          poVar3 = std::operator<<(poVar3,"\n");
          poVar3 = std::operator<<(poVar3,"          in: ");
          poVar3 = std::operator<<(poVar3,"\x1b[36m");
          poVar3 = std::operator<<(poVar3,"auto_quorum_size_election_test");
          poVar3 = std::operator<<(poVar3,"()\x1b[0m");
          poVar3 = std::operator<<(poVar3,"\n");
          poVar3 = std::operator<<(poVar3,"          at: ");
          poVar3 = std::operator<<(poVar3,"\x1b[32m");
          poVar3 = std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                  );
          poVar3 = std::operator<<(poVar3,"\x1b[0m:");
          poVar3 = std::operator<<(poVar3,"\x1b[1;35m");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x407);
          poVar3 = std::operator<<(poVar3,"\x1b[0m");
          poVar3 = std::operator<<(poVar3,"\n");
          poVar3 = std::operator<<(poVar3,
                                   "    value of: \x1b[1;34ms1->raftServer->get_leader()\x1b[0m\n");
          poVar3 = std::operator<<(poVar3,"    expected: \x1b[1;32m");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_274);
          poVar3 = std::operator<<(poVar3,"\x1b[0m\n");
          poVar3 = std::operator<<(poVar3,"      actual: \x1b[1;31m");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_278);
          std::operator<<(poVar3,"\x1b[0m\n");
          std::__cxx11::string::~string(local_298);
          TestSuite::failHandler();
          local_4 = -1;
          local_13c = 1;
        }
      }
      else {
        poVar3 = (ostream *)
                 std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
        poVar3 = std::operator<<(poVar3,"        time: ");
        poVar3 = std::operator<<(poVar3,"\x1b[1;30m");
        TestSuite::getTimeString_abi_cxx11_();
        poVar3 = std::operator<<(poVar3,local_260);
        poVar3 = std::operator<<(poVar3,"\x1b[0m");
        poVar3 = std::operator<<(poVar3,"\n");
        poVar3 = std::operator<<(poVar3,"      thread: ");
        poVar3 = std::operator<<(poVar3,"\x1b[33m");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
        local_264 = (int)std::setw(4);
        poVar3 = std::operator<<(poVar3,(_Setw)local_264);
        local_265 = (char)std::setfill<char>('0');
        poVar3 = std::operator<<(poVar3,local_265);
        local_270 = (native_handle_type)std::this_thread::get_id();
        sVar4 = std::hash<std::thread::id>::operator()
                          ((hash<std::thread::id> *)in_stack_ffffffffffffe270,
                           (id *)in_stack_ffffffffffffe268);
        pvVar5 = (void *)std::ostream::operator<<(poVar3,sVar4 & 0xffff);
        poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::dec);
        poVar3 = std::operator<<(poVar3,"\x1b[0m");
        poVar3 = std::operator<<(poVar3,"\n");
        poVar3 = std::operator<<(poVar3,"          in: ");
        poVar3 = std::operator<<(poVar3,"\x1b[36m");
        poVar3 = std::operator<<(poVar3,"auto_quorum_size_election_test");
        poVar3 = std::operator<<(poVar3,"()\x1b[0m");
        poVar3 = std::operator<<(poVar3,"\n");
        poVar3 = std::operator<<(poVar3,"          at: ");
        poVar3 = std::operator<<(poVar3,"\x1b[32m");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                );
        poVar3 = std::operator<<(poVar3,"\x1b[0m:");
        poVar3 = std::operator<<(poVar3,"\x1b[1;35m");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x406);
        poVar3 = std::operator<<(poVar3,"\x1b[0m");
        poVar3 = std::operator<<(poVar3,"\n");
        poVar3 = std::operator<<(poVar3,
                                 "    value of: \x1b[1;34ms1->raftServer->is_leader()\x1b[0m\n");
        poVar3 = std::operator<<(poVar3,"    expected: \x1b[1;32m");
        poVar3 = std::operator<<(poVar3,"true");
        poVar3 = std::operator<<(poVar3,"\x1b[0m\n");
        poVar3 = std::operator<<(poVar3,"      actual: \x1b[1;31m");
        poVar3 = std::operator<<(poVar3,"false");
        std::operator<<(poVar3,"\x1b[0m\n");
        std::__cxx11::string::~string(local_260);
        TestSuite::failHandler();
        local_4 = -1;
        local_13c = 1;
      }
    }
    else {
      poVar3 = (ostream *)
               std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"        time: ");
      poVar3 = std::operator<<(poVar3,"\x1b[1;30m");
      TestSuite::getTimeString_abi_cxx11_();
      poVar3 = std::operator<<(poVar3,local_160);
      poVar3 = std::operator<<(poVar3,"\x1b[0m");
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"      thread: ");
      poVar3 = std::operator<<(poVar3,"\x1b[33m");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
      local_164 = (int)std::setw(4);
      poVar3 = std::operator<<(poVar3,(_Setw)local_164);
      local_165 = (char)std::setfill<char>('0');
      poVar3 = std::operator<<(poVar3,local_165);
      local_170 = (native_handle_type)std::this_thread::get_id();
      sVar4 = std::hash<std::thread::id>::operator()
                        ((hash<std::thread::id> *)in_stack_ffffffffffffe270,
                         (id *)in_stack_ffffffffffffe268);
      pvVar5 = (void *)std::ostream::operator<<(poVar3,sVar4 & 0xffff);
      poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::dec);
      poVar3 = std::operator<<(poVar3,"\x1b[0m");
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"          in: ");
      poVar3 = std::operator<<(poVar3,"\x1b[36m");
      poVar3 = std::operator<<(poVar3,"auto_quorum_size_election_test");
      poVar3 = std::operator<<(poVar3,"()\x1b[0m");
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"          at: ");
      poVar3 = std::operator<<(poVar3,"\x1b[32m");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                              );
      poVar3 = std::operator<<(poVar3,"\x1b[0m:");
      poVar3 = std::operator<<(poVar3,"\x1b[1;35m");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x3f7);
      poVar3 = std::operator<<(poVar3,"\x1b[0m");
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"    value of: \x1b[1;34mmake_group(pkgs)\x1b[0m\n");
      poVar3 = std::operator<<(poVar3,"    expected: \x1b[1;32m");
      poVar3 = std::operator<<(poVar3,"0");
      poVar3 = std::operator<<(poVar3,"\x1b[0m\n");
      poVar3 = std::operator<<(poVar3,"      actual: \x1b[1;31m");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_140);
      std::operator<<(poVar3,"\x1b[0m\n");
      std::__cxx11::string::~string(local_160);
      TestSuite::failHandler();
      local_4 = -1;
      local_13c = 1;
    }
  }
  else {
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"        time: ");
    poVar3 = std::operator<<(poVar3,"\x1b[1;30m");
    TestSuite::getTimeString_abi_cxx11_();
    poVar3 = std::operator<<(poVar3,local_128);
    poVar3 = std::operator<<(poVar3,"\x1b[0m");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"      thread: ");
    poVar3 = std::operator<<(poVar3,"\x1b[33m");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
    local_12c = (int)std::setw(4);
    poVar3 = std::operator<<(poVar3,(_Setw)local_12c);
    local_12d = (char)std::setfill<char>('0');
    poVar3 = std::operator<<(poVar3,local_12d);
    local_138 = (native_handle_type)std::this_thread::get_id();
    sVar4 = std::hash<std::thread::id>::operator()
                      ((hash<std::thread::id> *)in_stack_ffffffffffffe270,
                       (id *)in_stack_ffffffffffffe268);
    pvVar5 = (void *)std::ostream::operator<<(poVar3,sVar4 & 0xffff);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::dec);
    poVar3 = std::operator<<(poVar3,"\x1b[0m");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"          in: ");
    poVar3 = std::operator<<(poVar3,"\x1b[36m");
    poVar3 = std::operator<<(poVar3,"auto_quorum_size_election_test");
    poVar3 = std::operator<<(poVar3,"()\x1b[0m");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"          at: ");
    poVar3 = std::operator<<(poVar3,"\x1b[32m");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                            );
    poVar3 = std::operator<<(poVar3,"\x1b[0m:");
    poVar3 = std::operator<<(poVar3,"\x1b[1;35m");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x3f4);
    poVar3 = std::operator<<(poVar3,"\x1b[0m");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"    value of: \x1b[1;34mlaunch_servers(pkgs, false)\x1b[0m\n");
    poVar3 = std::operator<<(poVar3,"    expected: \x1b[1;32m");
    poVar3 = std::operator<<(poVar3,"0");
    poVar3 = std::operator<<(poVar3,"\x1b[0m\n");
    poVar3 = std::operator<<(poVar3,"      actual: \x1b[1;31m");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_d8);
    std::operator<<(poVar3,"\x1b[0m\n");
    std::__cxx11::string::~string(local_128);
    TestSuite::failHandler();
    local_4 = -1;
    local_13c = 1;
  }
  std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::~vector
            ((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)in_stack_ffffffffffffe280);
  std::shared_ptr<RaftAsioPkg>::~shared_ptr((shared_ptr<RaftAsioPkg> *)0x1af854);
  std::shared_ptr<RaftAsioPkg>::~shared_ptr((shared_ptr<RaftAsioPkg> *)0x1af861);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_28);
  return local_4;
}

Assistant:

int auto_quorum_size_election_test() {
    reset_log_files();

    std::string s1_addr = "tcp://127.0.0.1:20010";
    std::string s2_addr = "tcp://127.0.0.1:20020";

    std::shared_ptr<RaftAsioPkg> s1 = std::make_shared<RaftAsioPkg>(1, s1_addr);
    std::shared_ptr<RaftAsioPkg> s2 = std::make_shared<RaftAsioPkg>(2, s2_addr);
    std::vector<RaftAsioPkg*> pkgs = {s1.get(), s2.get()};

    _msg("launching asio-raft servers\n");
    CHK_Z( launch_servers(pkgs, false) );

    _msg("organizing raft group\n");
    CHK_Z( make_group(pkgs) );
    TestSuite::sleep_sec(1, "wait for Raft group ready");

    // Set custom term counter, and enable auto quorum size mode.
    auto custom_inc_term = [](uint64_t cur_term) -> uint64_t {
        return (cur_term / 10) + 10;
    };
    s1->raftServer->set_inc_term_func(custom_inc_term);
    s2->raftServer->set_inc_term_func(custom_inc_term);

    raft_params params = s1->raftServer->get_current_params();
    params.auto_adjust_quorum_for_small_cluster_ = true;
    s1->raftServer->update_params(params);
    s2->raftServer->update_params(params);

    CHK_TRUE( s1->raftServer->is_leader() );
    CHK_EQ(1, s1->raftServer->get_leader());
    CHK_EQ(1, s2->raftServer->get_leader());

    // Replication.
    for (size_t ii=0; ii<10; ++ii) {
        std::string msg_str = std::to_string(ii);
        ptr<buffer> msg = buffer::alloc(sizeof(uint32_t) + msg_str.size());
        buffer_serializer bs(msg);
        bs.put_str(msg_str);
        s1->raftServer->append_entries( {msg} );
    }
    TestSuite::sleep_sec(1, "wait for replication");

    // State machine should be identical.
    CHK_OK( s2->getTestSm()->isSame( *s1->getTestSm() ) );

    // Shutdown S1.
    s1->raftServer->shutdown();
    s1.reset();

    // Wait for adjust quorum and self election.
    TestSuite::sleep_ms( RaftAsioPkg::HEARTBEAT_MS * 50,
                         "wait for quorum adjust" );

    // S2 should be a leader.
    CHK_TRUE( s2->raftServer->is_leader() );
    CHK_EQ(2, s2->raftServer->get_leader());
    uint64_t committed_idx = s2->raftServer->get_committed_log_idx();

    // More replication.
    for (size_t ii=10; ii<11; ++ii) {
        std::string msg_str = std::to_string(ii);
        ptr<buffer> msg = buffer::alloc(sizeof(uint32_t) + msg_str.size());
        buffer_serializer bs(msg);
        bs.put_str(msg_str);
        s2->raftServer->append_entries( {msg} );
    }

    // Replication should succeed: committed index should be moved forward.
    TestSuite::sleep_sec(1, "wait for replication");
    CHK_EQ( committed_idx + 1,
            s2->raftServer->get_committed_log_idx() );

    // Restart S1.
    _msg("launching S1 again\n");
    RaftAsioPkg s1_new(1, s1_addr);
    CHK_Z( launch_servers({&s1_new}, false) );
    TestSuite::sleep_sec(1, "wait for S2 ready");
    CHK_EQ( committed_idx + 1,
            s1_new.raftServer->get_committed_log_idx() );

    // S2 should remain as a leader.
    CHK_TRUE( s2->raftServer->is_leader() );
    CHK_EQ(2, s1_new.raftServer->get_leader());
    CHK_EQ(2, s2->raftServer->get_leader());

    // More replication.
    for (size_t ii=11; ii<12; ++ii) {
        std::string msg_str = std::to_string(ii);
        ptr<buffer> msg = buffer::alloc(sizeof(uint32_t) + msg_str.size());
        buffer_serializer bs(msg);
        bs.put_str(msg_str);
        s2->raftServer->append_entries( {msg} );
    }

    // Both of them should have the same commit number.
    TestSuite::sleep_sec(1, "wait for replication");
    CHK_EQ( committed_idx + 2,
            s1_new.raftServer->get_committed_log_idx() );
    CHK_EQ( committed_idx + 2,
            s2->raftServer->get_committed_log_idx() );

    s2->raftServer->shutdown();
    s1_new.raftServer->shutdown();
    TestSuite::sleep_sec(1, "shutting down");

    SimpleLogger::shutdown();
    return 0;
}